

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O0

double __thiscall r_exec::Group::update_sln_thr(Group *this)

{
  uint64_t uVar1;
  int iVar2;
  undefined4 extraout_var;
  float fVar3;
  undefined1 auVar4 [16];
  Atom local_2c [4];
  double local_28;
  double new_sln_thr;
  double percentage_per_period;
  float period;
  float percentage;
  Group *this_local;
  
  _period = this;
  (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
    super__Object._vptr__Object[4])(this,9);
  percentage_per_period._4_4_ = (float)r_code::Atom::asFloat();
  (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
    super__Object._vptr__Object[4])(this,0xb);
  percentage_per_period._0_4_ = (float)r_code::Atom::asFloat();
  if (((percentage_per_period._4_4_ == 0.0) && (!NAN(percentage_per_period._4_4_))) ||
     ((percentage_per_period._0_4_ == 0.0 && (!NAN(percentage_per_period._0_4_))))) {
    reset_decay_values(this);
  }
  else {
    new_sln_thr = (double)(percentage_per_period._4_4_ / percentage_per_period._0_4_);
    if ((new_sln_thr == this->decay_percentage_per_period) &&
       (!NAN(new_sln_thr) && !NAN(this->decay_percentage_per_period))) {
      (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
        super_Code.super__Object._vptr__Object[4])(this,10);
      fVar3 = (float)r_code::Atom::asFloat();
      if (((double)fVar3 == this->decay_target) && (!NAN((double)fVar3) && !NAN(this->decay_target))
         ) goto LAB_00236e3a;
    }
    this->decay_periods_to_go = (long)percentage_per_period._0_4_;
    this->decay_percentage_per_period = new_sln_thr;
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[4])(this,10);
    fVar3 = (float)r_code::Atom::asFloat();
    this->decay_target = (double)fVar3;
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[4])(this,10);
    fVar3 = (float)r_code::Atom::asFloat();
    if ((fVar3 != 0.0) || (NAN(fVar3))) {
      this->sln_decay = 0.0;
      this->sln_thr_decay = new_sln_thr;
    }
    else {
      this->sln_thr_decay = 0.0;
      this->sln_decay = new_sln_thr;
    }
  }
LAB_00236e3a:
  if ((0 < this->decay_periods_to_go) &&
     ((this->sln_thr_decay != 0.0 || (NAN(this->sln_thr_decay))))) {
    fVar3 = get_sln_thr(this);
    mod_sln_thr(this,(double)fVar3 * this->sln_thr_decay);
  }
  if (this->sln_thr_changes != 0) {
    fVar3 = get_sln_thr(this);
    uVar1 = this->sln_thr_changes;
    auVar4._8_4_ = (int)(uVar1 >> 0x20);
    auVar4._0_8_ = uVar1;
    auVar4._12_4_ = 0x45300000;
    local_28 = (double)fVar3 +
               this->acc_sln_thr /
               ((auVar4._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
    if (0.0 <= local_28) {
      if (1.0 < local_28) {
        local_28 = 1.0;
      }
    }
    else {
      local_28 = 0.0;
    }
    r_code::Atom::Float((float)local_28);
    iVar2 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[4])(this,2);
    r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar2),local_2c);
    r_code::Atom::~Atom(local_2c);
  }
  this->acc_sln_thr = 0.0;
  this->sln_thr_changes = 0;
  fVar3 = get_sln_thr(this);
  return (double)fVar3;
}

Assistant:

double Group::update_sln_thr()
{
    float percentage = code(GRP_DCY_PER).asFloat();
    float period = code(GRP_DCY_PRD).asFloat();

    if (percentage == 0 || period == 0) {
        reset_decay_values();
    } else {
        double percentage_per_period = percentage / period;

        if (percentage_per_period != decay_percentage_per_period || code(GRP_DCY_TGT).asFloat() != decay_target) { // recompute decay.
            decay_periods_to_go = period;
            decay_percentage_per_period = percentage_per_period;
            decay_target = code(GRP_DCY_TGT).asFloat();

            if (code(GRP_DCY_TGT).asFloat() == 0) {
                sln_thr_decay = 0;
                sln_decay = percentage_per_period;
            } else {
                sln_decay = 0;
                sln_thr_decay = percentage_per_period;
            }
        }
    }

    if (decay_periods_to_go > 0) {
        if (sln_thr_decay != 0) {
            mod_sln_thr(get_sln_thr()*sln_thr_decay);
        }
    }

    if (sln_thr_changes) {
        double new_sln_thr = get_sln_thr() + acc_sln_thr / sln_thr_changes;

        if (new_sln_thr < 0) {
            new_sln_thr = 0;
        } else if (new_sln_thr > 1) {
            new_sln_thr = 1;
        }

        code(GRP_SLN_THR) = r_code::Atom::Float(new_sln_thr);
    }

    acc_sln_thr = 0;
    sln_thr_changes = 0;
    return get_sln_thr();
}